

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

QString * __thiscall
QMessageBox::buttonText(QString *__return_storage_ptr__,QMessageBox *this,int button)

{
  QMessageBoxPrivate *this_00;
  QAbstractButton *this_01;
  long in_FS_OFFSET;
  QList<QAbstractButton_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  this_01 = QMessageBoxPrivate::abstractButtonForId(this_00,button);
  if (this_01 != (QAbstractButton *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QAbstractButton::text(__return_storage_ptr__,this_01);
      return __return_storage_ptr__;
    }
    goto LAB_0050e235;
  }
  QDialogButtonBox::buttons(&local_38,(QDialogButtonBox *)this_00->buttonBox);
  if (local_38.d.size == 0) {
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
      }
    }
    if ((button != 0x400) && (button != 1)) goto LAB_0050e20b;
    QMetaObject::tr((char *)__return_storage_ptr__,(char *)&QDialogButtonBox::staticMetaObject,
                    0x6f3d12);
  }
  else {
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
      }
    }
LAB_0050e20b:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_0050e235:
  __stack_chk_fail();
}

Assistant:

QString QMessageBox::buttonText(int button) const
{
    Q_D(const QMessageBox);

    if (QAbstractButton *abstractButton = d->abstractButtonForId(button)) {
        return abstractButton->text();
    } else if (d->buttonBox->buttons().isEmpty() && (button == Ok || button == Old_Ok)) {
        // for compatibility with Qt 4.0/4.1
        return QDialogButtonBox::tr("OK");
    }
    return QString();
}